

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_open_file_cache.c
# Opt level: O0

ngx_int_t ngx_open_cached_file
                    (ngx_open_file_cache_t *cache,ngx_str_t *name,ngx_open_file_info_t *of,
                    ngx_pool_t *pool)

{
  ngx_fd_t *pnVar1;
  ngx_log_t *pnVar2;
  ngx_log_t *log;
  undefined8 *puVar3;
  uint32_t hash_00;
  int iVar4;
  ngx_int_t nVar5;
  ngx_pool_cleanup_t *pnVar6;
  ngx_rbtree_node_t *pnVar7;
  int *piVar8;
  char *pcVar9;
  __dev_t local_100;
  ngx_open_file_cache_cleanup_t *ofcln;
  ngx_pool_cleanup_file_t *clnf;
  ngx_cached_open_file_t *file;
  ngx_pool_cleanup_t *cln;
  ngx_file_info_t fi;
  ngx_int_t rc;
  uint32_t hash;
  time_t now;
  ngx_pool_t *pool_local;
  ngx_open_file_info_t *of_local;
  ngx_str_t *name_local;
  ngx_open_file_cache_t *cache_local;
  
  of->fd = -1;
  of->err = 0;
  if (cache == (ngx_open_file_cache_t *)0x0) {
    if ((*(ushort *)&of->field_0x60 >> 3 & 1) != 0) {
      nVar5 = ngx_file_info_wrapper(name,of,(ngx_file_info_t *)&cln,pool->log);
      if (nVar5 == -1) {
        return -1;
      }
      of->uniq = fi.st_dev;
      of->mtime = fi.st_atim.tv_nsec;
      of->size = fi.st_rdev;
      if ((long)fi.st_rdev < fi.st_blksize * 0x200) {
        local_100 = fi.st_blksize << 9;
      }
      else {
        local_100 = fi.st_rdev;
      }
      of->fs_size = local_100;
      *(ushort *)&of->field_0x60 =
           *(ushort *)&of->field_0x60 & 0xff7f |
           (ushort)(((uint)fi.st_nlink & 0xf000) == 0x4000) << 7;
      *(ushort *)&of->field_0x60 =
           *(ushort *)&of->field_0x60 & 0xfeff |
           (ushort)(((uint)fi.st_nlink & 0xf000) == 0x8000) << 8;
      *(ushort *)&of->field_0x60 =
           *(ushort *)&of->field_0x60 & 0xfdff |
           (ushort)(((uint)fi.st_nlink & 0xf000) == 0xa000) << 9;
      *(ushort *)&of->field_0x60 =
           *(ushort *)&of->field_0x60 & 0xfbff | (ushort)(((uint)fi.st_nlink & 0x40) == 0x40) << 10;
      return 0;
    }
    pnVar6 = ngx_pool_cleanup_add(pool,0x18);
    if (pnVar6 == (ngx_pool_cleanup_t *)0x0) {
      return -1;
    }
    nVar5 = ngx_open_and_stat_file(name,of,pool->log);
    if (nVar5 != 0) {
      return nVar5;
    }
    if ((*(ushort *)&of->field_0x60 >> 7 & 1) != 0) {
      return 0;
    }
    pnVar6->handler = ngx_pool_cleanup_file;
    pnVar1 = (ngx_fd_t *)pnVar6->data;
    *pnVar1 = of->fd;
    *(u_char **)(pnVar1 + 2) = name->data;
    *(ngx_log_t **)(pnVar1 + 4) = pool->log;
    return 0;
  }
  pnVar6 = ngx_pool_cleanup_add(pool,0x20);
  if (pnVar6 == (ngx_pool_cleanup_t *)0x0) {
    return -1;
  }
  pnVar2 = (ngx_log_t *)ngx_cached_time->sec;
  hash_00 = ngx_crc32_long(name->data,name->len);
  clnf = (ngx_pool_cleanup_file_t *)ngx_open_file_lookup(cache,name,hash_00);
  if ((ngx_cached_open_file_t *)clnf == (ngx_cached_open_file_t *)0x0) {
    fi.__glibc_reserved[2] = ngx_open_and_stat_file(name,of,pool->log);
    if ((fi.__glibc_reserved[2] != 0) &&
       ((of->err == 0 || ((*(ushort *)&of->field_0x60 >> 5 & 1) == 0)))) goto LAB_0014167f;
LAB_00141107:
    if (cache->max <= cache->current) {
      ngx_expire_old_cached_files(cache,0,pool->log);
    }
    clnf = (ngx_pool_cleanup_file_t *)ngx_alloc(0x90,pool->log);
    if ((ngx_rbtree_node_t *)clnf == (ngx_rbtree_node_t *)0x0) {
      clnf = (ngx_pool_cleanup_file_t *)0x0;
LAB_0014167f:
      if (clnf != (ngx_pool_cleanup_file_t *)0x0) {
        ngx_rbtree_delete(&cache->rbtree,(ngx_rbtree_node_t *)clnf);
        cache->current = cache->current - 1;
        if (((ulong)clnf[5].name >> 2 & 0xffffff) == 0) {
          if (((*(int *)&clnf[3].name != -1) && (iVar4 = close(*(int *)&clnf[3].name), iVar4 == -1))
             && (1 < pool->log->log_level)) {
            pnVar2 = pool->log;
            piVar8 = __errno_location();
            ngx_log_error_core(2,pnVar2,*piVar8,"close() \"%s\" failed",clnf[2].name);
          }
          free(clnf[2].name);
          free(clnf);
        }
        else {
          clnf[5].name = (u_char *)((ulong)clnf[5].name & 0xfffffffffbffffff | 0x4000000);
        }
      }
      if (((of->fd != -1) && (iVar4 = close(of->fd), iVar4 == -1)) && (1 < pool->log->log_level)) {
        pnVar2 = pool->log;
        piVar8 = __errno_location();
        ngx_log_error_core(2,pnVar2,*piVar8,"close() \"%V\" failed",name);
      }
      return -1;
    }
    pnVar7 = (ngx_rbtree_node_t *)ngx_alloc(name->len + 1,pool->log);
    ((ngx_rbtree_node_t *)((long)clnf + 0x28))->right = pnVar7;
    if (((ngx_rbtree_node_t *)((long)clnf + 0x28))->right == (ngx_rbtree_node_t *)0x0) {
      free(clnf);
      clnf = (ngx_pool_cleanup_file_t *)0x0;
      goto LAB_0014167f;
    }
    ngx_cpystrn((u_char *)((ngx_rbtree_node_t *)((long)clnf + 0x28))->right,name->data,name->len + 1
               );
    ((ngx_rbtree_node_t *)clnf)->key = (ulong)hash_00;
    ngx_rbtree_insert(&cache->rbtree,(ngx_rbtree_node_t *)clnf);
    cache->current = cache->current + 1;
    *(undefined4 *)&((ngx_rbtree_node_t *)((long)clnf + 0x50))->field_0x24 = 1;
    ((ngx_rbtree_node_t *)((long)clnf + 0x78))->left =
         (ngx_rbtree_node_t *)
         ((ulong)((ngx_rbtree_node_t *)((long)clnf + 0x78))->left & 0xfffffffffc000003);
    ((ngx_rbtree_node_t *)((long)clnf + 0x78))->left =
         (ngx_rbtree_node_t *)
         ((ulong)((ngx_rbtree_node_t *)((long)clnf + 0x78))->left & 0xfffffffff7ffffff);
    ((ngx_rbtree_node_t *)((long)clnf + 0x78))->right = (ngx_rbtree_node_t *)0x0;
LAB_00141258:
    ngx_open_file_add_event(cache,(ngx_cached_open_file_t *)clnf,of,pool->log);
  }
  else {
    ((ngx_cached_open_file_t *)clnf)->uses = ((ngx_cached_open_file_t *)clnf)->uses + 1;
    ((((ngx_cached_open_file_t *)clnf)->queue).next)->prev =
         (((ngx_cached_open_file_t *)clnf)->queue).prev;
    ((((ngx_cached_open_file_t *)clnf)->queue).prev)->next =
         (((ngx_cached_open_file_t *)clnf)->queue).next;
    (((ngx_cached_open_file_t *)clnf)->queue).prev = (ngx_queue_t *)0x0;
    (((ngx_cached_open_file_t *)clnf)->queue).next = (ngx_queue_t *)0x0;
    if ((((ngx_cached_open_file_t *)clnf)->fd == -1) &&
       ((((ngx_cached_open_file_t *)clnf)->err == 0 &&
        ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) == 0)))) {
      fi.__glibc_reserved[2] = ngx_open_and_stat_file(name,of,pool->log);
      if ((fi.__glibc_reserved[2] != 0) &&
         ((of->err == 0 || ((*(ushort *)&of->field_0x60 >> 5 & 1) == 0)))) goto LAB_0014167f;
      goto LAB_00141258;
    }
    if (((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1b & 1) != 0) ||
       (((((ngx_cached_open_file_t *)clnf)->event == (ngx_event_t *)0x0 &&
         (((of->uniq == 0 || (of->uniq == ((ngx_cached_open_file_t *)clnf)->uniq)) &&
          ((long)pnVar2 - ((ngx_cached_open_file_t *)clnf)->created < of->valid)))) &&
        (((uint)(*(ushort *)&of->field_0x60 & 3) ==
          ((uint)*(undefined8 *)&((ngx_cached_open_file_t *)clnf)->field_0x80 & 3) &&
         (of->disable_symlinks_from == ((ngx_cached_open_file_t *)clnf)->disable_symlinks_from))))))
    {
      if (((ngx_cached_open_file_t *)clnf)->err == 0) {
        of->fd = ((ngx_cached_open_file_t *)clnf)->fd;
        of->uniq = ((ngx_cached_open_file_t *)clnf)->uniq;
        of->mtime = ((ngx_cached_open_file_t *)clnf)->mtime;
        of->size = ((ngx_cached_open_file_t *)clnf)->size;
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xff7f |
             ((ushort)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c) & 1) << 7;
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xfeff |
             ((ushort)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1d) & 1) << 8;
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xfdff |
             ((ushort)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1e) & 1) << 9;
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xfbff |
             ((ushort)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1f) & 1) << 10;
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xf7ff |
             ((ushort)((ulong)*(undefined8 *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x20)
             & 1) << 0xb;
        if ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) == 0) {
          *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 =
               *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 & 0xfffffffffc000003 |
               ((ulong)(((uint)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 2) &
                        0xffffff) + 1) & 0xffffff) << 2;
          ngx_open_file_add_event(cache,(ngx_cached_open_file_t *)clnf,of,pool->log);
        }
      }
      else {
        of->err = ((ngx_cached_open_file_t *)clnf)->err;
        pcVar9 = "open()";
        if ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 & 3) != 0) {
          pcVar9 = "openat()";
        }
        of->failed = pcVar9;
      }
      goto LAB_001414f0;
    }
    if ((pool->log->log_level & 0x10) != 0) {
      ngx_log_error_core(8,pool->log,0,"retest open file: %s, fd:%d, c:%d, e:%d",
                         ((ngx_cached_open_file_t *)clnf)->name,
                         (ulong)(uint)((ngx_cached_open_file_t *)clnf)->fd,
                         (uint)(*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 2) &
                         0xffffff,((ngx_cached_open_file_t *)clnf)->err);
    }
    if ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) != 0) {
      *(ushort *)&of->field_0x60 = *(ushort *)&of->field_0x60 & 0xfffb | 4;
    }
    of->fd = ((ngx_cached_open_file_t *)clnf)->fd;
    of->uniq = ((ngx_cached_open_file_t *)clnf)->uniq;
    fi.__glibc_reserved[2] = ngx_open_and_stat_file(name,of,pool->log);
    if ((fi.__glibc_reserved[2] != 0) &&
       ((of->err == 0 || ((*(ushort *)&of->field_0x60 >> 5 & 1) == 0)))) goto LAB_0014167f;
    if ((*(ushort *)&of->field_0x60 >> 7 & 1) == 0) {
      if (of->err == 0) {
        if (((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) != 0) ||
           (((ngx_cached_open_file_t *)clnf)->err != 0)) goto LAB_00141258;
        if (of->uniq != ((ngx_cached_open_file_t *)clnf)->uniq) goto LAB_00140ff3;
        if (((ngx_cached_open_file_t *)clnf)->event != (ngx_event_t *)0x0) {
          *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 =
               *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 & 0xfffffffff7ffffff |
               0x8000000;
        }
        *(ushort *)&of->field_0x60 =
             *(ushort *)&of->field_0x60 & 0xf7ff |
             ((ushort)((ulong)*(undefined8 *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x20)
             & 1) << 0xb;
      }
      else if ((((ngx_cached_open_file_t *)clnf)->err == 0) &&
              ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) == 0))
      goto LAB_00140ff3;
    }
    else if (((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 0x1c & 1) == 0) &&
            (((ngx_cached_open_file_t *)clnf)->err == 0)) {
LAB_00140ff3:
      if ((*(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 >> 2 & 0xffffff) != 0) {
        ngx_rbtree_delete(&cache->rbtree,(ngx_rbtree_node_t *)clnf);
        cache->current = cache->current - 1;
        *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 =
             *(ulong *)&((ngx_cached_open_file_t *)clnf)->field_0x80 & 0xfffffffffbffffff |
             0x4000000;
        goto LAB_00141107;
      }
      ngx_open_file_del_event((ngx_cached_open_file_t *)clnf);
      iVar4 = close(((ngx_cached_open_file_t *)clnf)->fd);
      if ((iVar4 == -1) && (1 < pool->log->log_level)) {
        log = pool->log;
        piVar8 = __errno_location();
        ngx_log_error_core(2,log,*piVar8,"close() \"%V\" failed",name);
      }
      goto LAB_00141258;
    }
  }
  *(ngx_fd_t *)&clnf[3].name = of->fd;
  *(ngx_err_t *)&clnf[4].log = of->err;
  clnf[5].name = (u_char *)
                 ((ulong)clnf[5].name & 0xfffffffffffffffc | (ulong)(*(ushort *)&of->field_0x60 & 3)
                 );
  *(size_t *)(clnf + 5) = of->disable_symlinks_from;
  if (of->err == 0) {
    clnf[3].log = (ngx_log_t *)of->uniq;
    *(time_t *)(clnf + 4) = of->mtime;
    clnf[4].name = (u_char *)of->size;
    clnf[5].name = (u_char *)((ulong)clnf[5].name & 0xfffffffffbffffff);
    clnf[5].name = (u_char *)
                   ((ulong)clnf[5].name & 0xffffffffefffffff |
                   (ulong)(*(ushort *)&of->field_0x60 >> 7 & 1) << 0x1c);
    clnf[5].name = (u_char *)
                   ((ulong)clnf[5].name & 0xffffffffdfffffff |
                   (ulong)(*(ushort *)&of->field_0x60 >> 8 & 1) << 0x1d);
    clnf[5].name = (u_char *)
                   ((ulong)clnf[5].name & 0xffffffffbfffffff |
                   (ulong)(*(ushort *)&of->field_0x60 >> 9 & 1) << 0x1e);
    clnf[5].name = (u_char *)
                   ((ulong)clnf[5].name & 0xffffffff7fffffff |
                   (ulong)(*(ushort *)&of->field_0x60 >> 10 & 1) << 0x1f);
    clnf[5].name = (u_char *)
                   ((ulong)clnf[5].name & 0xfffffffeffffffff |
                   (ulong)(*(ushort *)&of->field_0x60 >> 0xb & 1) << 0x20);
    if ((*(ushort *)&of->field_0x60 >> 7 & 1) == 0) {
      clnf[5].name = (u_char *)
                     ((ulong)clnf[5].name & 0xfffffffffc000003 |
                     ((ulong)(((uint)((ulong)clnf[5].name >> 2) & 0xffffff) + 1) & 0xffffff) << 2);
    }
  }
  clnf[2].log = pnVar2;
LAB_001414f0:
  *(ngx_log_t **)(clnf + 3) = pnVar2;
  *(ngx_queue_t **)(clnf + 2) = (cache->expire_queue).next;
  **(long **)(clnf + 2) = (long)&clnf[1].log;
  clnf[1].log = (ngx_log_t *)&cache->expire_queue;
  (cache->expire_queue).next = (ngx_queue_t *)&clnf[1].log;
  if ((pool->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,pool->log,0,"cached open file: %s, fd:%d, c:%d, e:%d, u:%d",clnf[2].name,
                       (ulong)*(uint *)&clnf[3].name,(uint)((ulong)clnf[5].name >> 2) & 0xffffff,
                       *(undefined4 *)&clnf[4].log,*(undefined4 *)((long)&clnf[4].log + 4));
  }
  if (of->err == 0) {
    if ((*(ushort *)&of->field_0x60 >> 7 & 1) == 0) {
      pnVar6->handler = ngx_open_file_cleanup;
      puVar3 = (undefined8 *)pnVar6->data;
      *puVar3 = cache;
      puVar3[1] = clnf;
      puVar3[2] = of->min_uses;
      puVar3[3] = pool->log;
    }
    return 0;
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_open_cached_file(ngx_open_file_cache_t *cache, ngx_str_t *name,
    ngx_open_file_info_t *of, ngx_pool_t *pool)
{
    time_t                          now;
    uint32_t                        hash;
    ngx_int_t                       rc;
    ngx_file_info_t                 fi;
    ngx_pool_cleanup_t             *cln;
    ngx_cached_open_file_t         *file;
    ngx_pool_cleanup_file_t        *clnf;
    ngx_open_file_cache_cleanup_t  *ofcln;

    of->fd = NGX_INVALID_FILE;
    of->err = 0;

    if (cache == NULL) {

        if (of->test_only) {

            if (ngx_file_info_wrapper(name, of, &fi, pool->log)
                == NGX_FILE_ERROR)
            {
                return NGX_ERROR;
            }

            of->uniq = ngx_file_uniq(&fi);
            of->mtime = ngx_file_mtime(&fi);
            of->size = ngx_file_size(&fi);
            of->fs_size = ngx_file_fs_size(&fi);
            of->is_dir = ngx_is_dir(&fi);
            of->is_file = ngx_is_file(&fi);
            of->is_link = ngx_is_link(&fi);
            of->is_exec = ngx_is_exec(&fi);

            return NGX_OK;
        }

        cln = ngx_pool_cleanup_add(pool, sizeof(ngx_pool_cleanup_file_t));
        if (cln == NULL) {
            return NGX_ERROR;
        }

        rc = ngx_open_and_stat_file(name, of, pool->log);

        if (rc == NGX_OK && !of->is_dir) {
            cln->handler = ngx_pool_cleanup_file;
            clnf = cln->data;

            clnf->fd = of->fd;
            clnf->name = name->data;
            clnf->log = pool->log;
        }

        return rc;
    }

    cln = ngx_pool_cleanup_add(pool, sizeof(ngx_open_file_cache_cleanup_t));
    if (cln == NULL) {
        return NGX_ERROR;
    }

    now = ngx_time();

    hash = ngx_crc32_long(name->data, name->len);

    file = ngx_open_file_lookup(cache, name, hash);

    if (file) {

        file->uses++;

        ngx_queue_remove(&file->queue);

        if (file->fd == NGX_INVALID_FILE && file->err == 0 && !file->is_dir) {

            /* file was not used often enough to keep open */

            rc = ngx_open_and_stat_file(name, of, pool->log);

            if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
                goto failed;
            }

            goto add_event;
        }

        if (file->use_event
            || (file->event == NULL
                && (of->uniq == 0 || of->uniq == file->uniq)
                && now - file->created < of->valid
#if (NGX_HAVE_OPENAT)
                && of->disable_symlinks == file->disable_symlinks
                && of->disable_symlinks_from == file->disable_symlinks_from
#endif
            ))
        {
            if (file->err == 0) {

                of->fd = file->fd;
                of->uniq = file->uniq;
                of->mtime = file->mtime;
                of->size = file->size;

                of->is_dir = file->is_dir;
                of->is_file = file->is_file;
                of->is_link = file->is_link;
                of->is_exec = file->is_exec;
                of->is_directio = file->is_directio;

                if (!file->is_dir) {
                    file->count++;
                    ngx_open_file_add_event(cache, file, of, pool->log);
                }

            } else {
                of->err = file->err;
#if (NGX_HAVE_OPENAT)
                of->failed = file->disable_symlinks ? ngx_openat_file_n
                                                    : ngx_open_file_n;
#else
                of->failed = ngx_open_file_n;
#endif
            }

            goto found;
        }

        ngx_log_debug4(NGX_LOG_DEBUG_CORE, pool->log, 0,
                       "retest open file: %s, fd:%d, c:%d, e:%d",
                       file->name, file->fd, file->count, file->err);

        if (file->is_dir) {

            /*
             * chances that directory became file are very small
             * so test_dir flag allows to use a single syscall
             * in ngx_file_info() instead of three syscalls
             */

            of->test_dir = 1;
        }

        of->fd = file->fd;
        of->uniq = file->uniq;

        rc = ngx_open_and_stat_file(name, of, pool->log);

        if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
            goto failed;
        }

        if (of->is_dir) {

            if (file->is_dir || file->err) {
                goto update;
            }

            /* file became directory */

        } else if (of->err == 0) {  /* file */

            if (file->is_dir || file->err) {
                goto add_event;
            }

            if (of->uniq == file->uniq) {

                if (file->event) {
                    file->use_event = 1;
                }

                of->is_directio = file->is_directio;

                goto update;
            }

            /* file was changed */

        } else { /* error to cache */

            if (file->err || file->is_dir) {
                goto update;
            }

            /* file was removed, etc. */
        }

        if (file->count == 0) {

            ngx_open_file_del_event(file);

            if (ngx_close_file(file->fd) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                              ngx_close_file_n " \"%V\" failed", name);
            }

            goto add_event;
        }

        ngx_rbtree_delete(&cache->rbtree, &file->node);

        cache->current--;

        file->close = 1;

        goto create;
    }

    /* not found */

    rc = ngx_open_and_stat_file(name, of, pool->log);

    if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
        goto failed;
    }

create:

    if (cache->current >= cache->max) {
        ngx_expire_old_cached_files(cache, 0, pool->log);
    }

    file = ngx_alloc(sizeof(ngx_cached_open_file_t), pool->log);

    if (file == NULL) {
        goto failed;
    }

    file->name = ngx_alloc(name->len + 1, pool->log);

    if (file->name == NULL) {
        ngx_free(file);
        file = NULL;
        goto failed;
    }

    ngx_cpystrn(file->name, name->data, name->len + 1);

    file->node.key = hash;

    ngx_rbtree_insert(&cache->rbtree, &file->node);

    cache->current++;

    file->uses = 1;
    file->count = 0;
    file->use_event = 0;
    file->event = NULL;

add_event:

    ngx_open_file_add_event(cache, file, of, pool->log);

update:

    file->fd = of->fd;
    file->err = of->err;
#if (NGX_HAVE_OPENAT)
    file->disable_symlinks = of->disable_symlinks;
    file->disable_symlinks_from = of->disable_symlinks_from;
#endif

    if (of->err == 0) {
        file->uniq = of->uniq;
        file->mtime = of->mtime;
        file->size = of->size;

        file->close = 0;

        file->is_dir = of->is_dir;
        file->is_file = of->is_file;
        file->is_link = of->is_link;
        file->is_exec = of->is_exec;
        file->is_directio = of->is_directio;

        if (!of->is_dir) {
            file->count++;
        }
    }

    file->created = now;

found:

    file->accessed = now;

    ngx_queue_insert_head(&cache->expire_queue, &file->queue);

    ngx_log_debug5(NGX_LOG_DEBUG_CORE, pool->log, 0,
                   "cached open file: %s, fd:%d, c:%d, e:%d, u:%d",
                   file->name, file->fd, file->count, file->err, file->uses);

    if (of->err == 0) {

        if (!of->is_dir) {
            cln->handler = ngx_open_file_cleanup;
            ofcln = cln->data;

            ofcln->cache = cache;
            ofcln->file = file;
            ofcln->min_uses = of->min_uses;
            ofcln->log = pool->log;
        }

        return NGX_OK;
    }

    return NGX_ERROR;

failed:

    if (file) {
        ngx_rbtree_delete(&cache->rbtree, &file->node);

        cache->current--;

        if (file->count == 0) {

            if (file->fd != NGX_INVALID_FILE) {
                if (ngx_close_file(file->fd) == NGX_FILE_ERROR) {
                    ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                                  ngx_close_file_n " \"%s\" failed",
                                  file->name);
                }
            }

            ngx_free(file->name);
            ngx_free(file);

        } else {
            file->close = 1;
        }
    }

    if (of->fd != NGX_INVALID_FILE) {
        if (ngx_close_file(of->fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                          ngx_close_file_n " \"%V\" failed", name);
        }
    }

    return NGX_ERROR;
}